

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

void __thiscall
TPZFMatrix<long>::TPZFMatrix
          (TPZFMatrix<long> *this,initializer_list<std::initializer_list<long>_> *list)

{
  TPZFMatrix<long> *in_RSI;
  TPZRegisterClassId *in_RDI;
  void **in_stack_ffffffffffffffc8;
  TPZMatrix<long> *in_stack_ffffffffffffffd0;
  int64_t in_stack_ffffffffffffffd8;
  TPZManVector<int,_5> *this_00;
  initializer_list<std::initializer_list<long>_> *list_00;
  
  list_00 = (initializer_list<std::initializer_list<long>_> *)0x0;
  this_00 = (TPZManVector<int,_5> *)0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZFMatrix<long>>(in_RDI,0x21);
  TPZMatrix<long>::TPZMatrix(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *(undefined ***)in_RDI = &PTR__TPZFMatrix_023f35c8;
  TPZManVector<int,_5>::TPZManVector(this_00,in_stack_ffffffffffffffd8);
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x70));
  Initialize(in_RSI,list_00);
  return;
}

Assistant:

inline TPZFMatrix<TVar>::TPZFMatrix(const std::initializer_list<std::initializer_list<TVar>> &list)
: TPZRegisterClassId(&TPZFMatrix<TVar>::ClassId)
{
    this->Initialize(list);
}